

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

void capnp::_::anon_unknown_0::doForwardingTest(bool allowForwarding,bool addReflectionLeg)

{
  StringPtr to;
  ArrayDisposer *this;
  bool bVar1;
  uint uVar2;
  Event *pEVar3;
  Vat *pVVar4;
  Client *cap;
  void *__buf;
  nfds_t __nfds;
  void *__buf_00;
  int iVar5;
  bool local_6dd;
  int local_6dc;
  bool _kj_shouldLog_9;
  DebugExpression<unsigned_int_&> DStack_6d8;
  undefined1 local_6d0 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_9;
  bool _kj_shouldLog_8;
  DebugExpression<unsigned_int_&> DStack_6a0;
  undefined1 local_698 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_8;
  undefined1 local_668 [7];
  bool _kj_shouldLog_7;
  DebugExpressionStart local_660 [8];
  undefined1 local_658 [8];
  DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>,_const_kj::None_&>
  _kjCondition_7;
  DebugExpression<unsigned_int&> aDStack_628 [3];
  bool _kj_shouldLog_6;
  undefined1 local_620 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_6;
  DebugExpression<unsigned_int&> aDStack_5f0 [7];
  bool _kj_shouldLog_5;
  DebugComparison<unsigned_int_&,_bool_&> local_5e8;
  int local_5c0 [2];
  int _kjCondition_5;
  bool _kj_shouldLog_4;
  DebugExpressionStart local_5b0 [8];
  undefined1 local_5a8 [8];
  DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>,_const_kj::None_&>
  _kjCondition_4;
  undefined1 local_578 [7];
  bool _kj_shouldLog_3;
  DebugExpressionStart local_570 [8];
  undefined1 local_568 [8];
  DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>,_const_kj::None_&>
  _kjCondition_3;
  undefined1 local_538 [7];
  bool _kj_shouldLog_2;
  DebugExpressionStart local_530 [8];
  undefined1 local_528 [8];
  DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>,_const_kj::None_&>
  _kjCondition_2;
  undefined1 local_4f8 [7];
  bool _kj_shouldLog_1;
  DebugExpressionStart local_4f0 [8];
  undefined1 local_4e8 [8];
  DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>,_const_kj::None_&>
  _kjCondition_1;
  undefined1 auStack_4b8 [7];
  bool _kj_shouldLog;
  undefined8 local_4b0;
  DebugExpression<capnp::Text::Reader> local_4a8;
  undefined1 local_498 [8];
  DebugComparison<capnp::Text::Reader,_const_char_(&)[4]> _kjCondition;
  SourceLocation local_460;
  Maybe<capnp::MessageSize> local_440;
  Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
  local_428;
  undefined1 local_3f0 [48];
  undefined1 local_3c0 [8];
  Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults> resp;
  SourceLocation local_378;
  undefined1 local_360 [120];
  Maybe<capnp::MessageSize> local_2e8;
  undefined1 local_2d0 [8];
  Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  req;
  size_t local_290;
  undefined1 local_288 [8];
  Client daveCap;
  undefined1 local_260 [8];
  Client bobCap;
  Vat *dave;
  int eveHandleCount;
  int eveCallCount;
  ArrayPtr<const_char> local_1f8;
  Event *local_1e8;
  Vat *carol;
  int carolHandleCount;
  int carolCallCount;
  Vat *bob;
  Vat *alice;
  TestContext context;
  bool addReflectionLeg_local;
  bool allowForwarding_local;
  
  context.bob._6_1_ = addReflectionLeg;
  context.bob._7_1_ = allowForwarding;
  TestContext::TestContext((TestContext *)&alice);
  context.network.dumper.schemas.table.indexes.buckets.disposer._0_1_ = context.bob._7_1_ & 1;
  bob = (Vat *)context.vats.table.indexes.buckets.disposer;
  _carolHandleCount = context.alice;
  carol._4_4_ = 0;
  carol._0_4_ = 0;
  kj::StringPtr::StringPtr((StringPtr *)&local_1f8,"carol");
  kj::heap<capnp::_::TestMoreStuffImpl,int&,int&>
            ((kj *)&eveHandleCount,(int *)((long)&carol + 4),(int *)&carol);
  pEVar3 = (Event *)_::(anonymous_namespace)::TestContext::
                    initVat<kj::Own<capnp::_::TestMoreStuffImpl,decltype(nullptr)>>
                              ((TestContext *)&alice,(StringPtr)local_1f8,
                               (Own<capnp::_::TestMoreStuffImpl,_std::nullptr_t> *)&eveHandleCount);
  kj::Own<capnp::_::TestMoreStuffImpl,_std::nullptr_t>::~Own
            ((Own<capnp::_::TestMoreStuffImpl,_std::nullptr_t> *)&eveHandleCount);
  bobCap._16_8_ = &alice;
  local_1e8 = pEVar3;
  pVVar4 = doForwardingTest::anon_class_32_4_6f47baf8::operator()
                     ((anon_class_32_4_6f47baf8 *)&bobCap.field_0x10);
  this = context.vats.table.indexes.buckets.disposer;
  kj::StringPtr::StringPtr((StringPtr *)&daveCap.field_0x10,"bob");
  TestContext::Vat::connect<capnproto_test::capnp::test::TestInterface>
            ((Client *)local_260,(Vat *)this,(StringPtr)stack0xfffffffffffffd90,false);
  kj::StringPtr::StringPtr((StringPtr *)&req.hook.ptr,"dave");
  to.content.size_ = local_290;
  to.content.ptr = (char *)req.hook.ptr;
  iVar5 = 0;
  TestContext::Vat::connect<capnproto_test::capnp::test::TestMoreStuff>
            ((Client *)local_288,(Vat *)context.vats.table.indexes.buckets.disposer,to,false);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_2e8);
  capnproto_test::capnp::test::TestMoreStuff::Client::holdRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
              *)local_2d0,(Client *)local_288,&local_2e8);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_2e8);
  cap = kj::mv<capnproto_test::capnp::test::TestInterface::Client>((Client *)local_260);
  capnproto_test::capnp::test::TestMoreStuff::HoldParams::Builder::setCap((Builder *)local_2d0,cap);
  Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
          *)local_360,(int)local_2d0,__buf,local_290,iVar5);
  iVar5 = 5;
  kj::SourceLocation::SourceLocation
            (&local_378,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
             ,&DAT_009ea64d,0x895);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_> *)
             (local_360 + 0x30),local_360);
  Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>::~Response
            ((Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults> *)(local_360 + 0x30)
            );
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::HoldResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::HoldResults> *)local_360);
  Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  ::~Request((Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
              *)local_2d0);
  uVar2 = kj::MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&kj::maxValue);
  kj::WaitScope::poll((WaitScope *)&context.loop.currentlyFiring,(pollfd *)(ulong)uVar2,__nfds,
                      (int)local_378._16_8_);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_440);
  capnproto_test::capnp::test::TestMoreStuff::Client::callHeldRequest
            (&local_428,(Client *)local_288,&local_440);
  Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
          *)local_3f0,(int)&local_428,__buf_00,local_378._16_8_,iVar5);
  kj::SourceLocation::SourceLocation
            (&local_460,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
             ,&DAT_009ea64d,0x89e,0x11);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>
              *)local_3c0,local_3f0);
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults> *)local_3f0
            );
  Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
  ::~Request(&local_428);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_440);
  _auStack_4b8 = (undefined1  [16])
                 capnproto_test::capnp::test::TestMoreStuff::CallHeldResults::Reader::getS
                           ((Reader *)local_3c0);
  local_4a8 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Reader *)auStack_4b8);
  kj::_::DebugExpression<capnp::Text::Reader>::operator==
            ((DebugComparison<capnp::Text::Reader,_const_char_(&)[4]> *)local_498,&local_4a8,
             (char (*) [4])0x9f29a5);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_498);
  if (!bVar1) {
    _kjCondition_1._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._39_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[38],kj::_::DebugComparison<capnp::Text::Reader,char_const(&)[4]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x89f,ERROR,"\"failed: expected \" \"resp.getS() == \\\"bar\\\"\", _kjCondition",
                 (char (*) [38])"failed: expected resp.getS() == \"bar\"",
                 (DebugComparison<capnp::Text::Reader,_const_char_(&)[4]> *)local_498);
      _kjCondition_1._39_1_ = 0;
    }
  }
  Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>::~Response
            ((Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults> *)local_3c0);
  TestVat::getConnectionTo((TestVat *)local_4f8,pVVar4->vatNetwork);
  kj::_::DebugExpressionStart::operator<<
            (local_4f0,
             (Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&> *)
             &kj::_::MAGIC_ASSERT);
  kj::_::DebugExpression<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>>::
  operator!=((DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>,_const_kj::None_&>
              *)local_4e8,
             (DebugExpression<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>>
              *)local_4f0,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_4e8);
  if (!bVar1) {
    _kjCondition_2._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_2._39_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[79],kj::_::DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x8a3,ERROR,
                 "\"failed: expected \" \"dave.vatNetwork.getConnectionTo(carol.vatNetwork) != kj::none\", _kjCondition"
                 ,(char (*) [79])
                  "failed: expected dave.vatNetwork.getConnectionTo(carol.vatNetwork) != kj::none",
                 (DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>,_const_kj::None_&>
                  *)local_4e8);
      _kjCondition_2._39_1_ = 0;
    }
  }
  TestVat::getConnectionTo((TestVat *)local_538,(TestVat *)local_1e8->_vptr_Event);
  kj::_::DebugExpressionStart::operator<<
            (local_530,
             (Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&> *)
             &kj::_::MAGIC_ASSERT);
  kj::_::DebugExpression<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>>::
  operator!=((DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>,_const_kj::None_&>
              *)local_528,
             (DebugExpression<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>>
              *)local_530,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_528);
  if (!bVar1) {
    _kjCondition_3._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_3._39_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[78],kj::_::DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x8a4,ERROR,
                 "\"failed: expected \" \"carol.vatNetwork.getConnectionTo(bob.vatNetwork) != kj::none\", _kjCondition"
                 ,(char (*) [78])
                  "failed: expected carol.vatNetwork.getConnectionTo(bob.vatNetwork) != kj::none",
                 (DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>,_const_kj::None_&>
                  *)local_528);
      _kjCondition_3._39_1_ = 0;
    }
  }
  TestVat::getConnectionTo((TestVat *)local_578,(TestVat *)local_1e8->_vptr_Event);
  kj::_::DebugExpressionStart::operator<<
            (local_570,
             (Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&> *)
             &kj::_::MAGIC_ASSERT);
  kj::_::DebugExpression<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>>::
  operator==((DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>,_const_kj::None_&>
              *)local_568,
             (DebugExpression<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>>
              *)local_570,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_568);
  if (!bVar1) {
    _kjCondition_4._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_4._39_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[80],kj::_::DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x8a7,ERROR,
                 "\"failed: expected \" \"carol.vatNetwork.getConnectionTo(alice.vatNetwork) == kj::none\", _kjCondition"
                 ,(char (*) [80])
                  "failed: expected carol.vatNetwork.getConnectionTo(alice.vatNetwork) == kj::none",
                 (DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>,_const_kj::None_&>
                  *)local_568);
      _kjCondition_4._39_1_ = 0;
    }
  }
  if ((context.bob._7_1_ & 1) == 0) {
    TestVat::getConnectionTo((TestVat *)local_668,pVVar4->vatNetwork);
    kj::_::DebugExpressionStart::operator<<
              (local_660,
               (Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&> *)
               &kj::_::MAGIC_ASSERT);
    kj::_::DebugExpression<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>>::
    operator!=((DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>,_const_kj::None_&>
                *)local_658,
               (DebugExpression<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>>
                *)local_660,(None *)&kj::none);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_658);
    if (!bVar1) {
      _kjCondition_8._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_8._39_1_ != '\0') {
        kj::_::Debug::
        log<char_const(&)[77],kj::_::DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>,kj::None_const&>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                   ,0x8b2,ERROR,
                   "\"failed: expected \" \"dave.vatNetwork.getConnectionTo(bob.vatNetwork) != kj::none\", _kjCondition"
                   ,(char (*) [77])
                    "failed: expected dave.vatNetwork.getConnectionTo(bob.vatNetwork) != kj::none",
                   (DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>,_const_kj::None_&>
                    *)local_658);
        _kjCondition_8._39_1_ = 0;
      }
    }
    DStack_6a0 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                            (uint *)((long)&context.network.dumper.schemas.table.indexes.buckets +
                                    0x14));
    _kjCondition_9._36_4_ = 0;
    kj::_::DebugExpression<unsigned_int&>::operator==
              ((DebugComparison<unsigned_int_&,_int> *)local_698,
               (DebugExpression<unsigned_int&> *)&stack0xfffffffffffff960,
               (int *)&_kjCondition_9.field_0x24);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_698);
    if (!bVar1) {
      _kjCondition_9._35_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_9._35_1_ != '\0') {
        kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<unsigned_int&,int>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                   ,0x8b5,ERROR,
                   "\"failed: expected \" \"context.network.forwardCount == 0\", _kjCondition",
                   (char (*) [51])"failed: expected context.network.forwardCount == 0",
                   (DebugComparison<unsigned_int_&,_int> *)local_698);
        _kjCondition_9._35_1_ = 0;
      }
    }
    DStack_6d8 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                            (uint *)&context.network.forwardingEnabled);
    local_6dc = 1;
    kj::_::DebugExpression<unsigned_int&>::operator==
              ((DebugComparison<unsigned_int_&,_int> *)local_6d0,
               (DebugExpression<unsigned_int&> *)&stack0xfffffffffffff928,&local_6dc);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_6d0);
    if (!bVar1) {
      local_6dd = kj::_::Debug::shouldLog(ERROR);
      while (local_6dd != false) {
        kj::_::Debug::log<char_const(&)[57],kj::_::DebugComparison<unsigned_int&,int>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                   ,0x8b6,ERROR,
                   "\"failed: expected \" \"context.network.deniedForwardCount == 1\", _kjCondition"
                   ,(char (*) [57])"failed: expected context.network.deniedForwardCount == 1",
                   (DebugComparison<unsigned_int_&,_int> *)local_6d0);
        local_6dd = false;
      }
    }
  }
  else {
    TestVat::getConnectionTo((TestVat *)&_kjCondition_5,pVVar4->vatNetwork);
    kj::_::DebugExpressionStart::operator<<
              (local_5b0,
               (Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&> *)
               &kj::_::MAGIC_ASSERT);
    kj::_::DebugExpression<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>>::
    operator==((DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>,_const_kj::None_&>
                *)local_5a8,
               (DebugExpression<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>>
                *)local_5b0,(None *)&kj::none);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_5a8);
    if (!bVar1) {
      local_5c0[1]._3_1_ = kj::_::Debug::shouldLog(ERROR);
      while ((bool)local_5c0[1]._3_1_ != false) {
        kj::_::Debug::
        log<char_const(&)[77],kj::_::DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>,kj::None_const&>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                   ,0x8ab,ERROR,
                   "\"failed: expected \" \"dave.vatNetwork.getConnectionTo(bob.vatNetwork) == kj::none\", _kjCondition"
                   ,(char (*) [77])
                    "failed: expected dave.vatNetwork.getConnectionTo(bob.vatNetwork) == kj::none",
                   (DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>,_const_kj::None_&>
                    *)local_5a8);
        local_5c0[1]._3_1_ = false;
      }
    }
    _aDStack_5f0 = kj::_::DebugExpressionStart::operator<<
                             ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                              (uint *)((long)&context.network.dumper.schemas.table.indexes.buckets +
                                      0x14));
    kj::_::DebugExpression<unsigned_int&>::operator==
              (&local_5e8,aDStack_5f0,(bool *)((long)&context.bob + 6));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_5e8);
    local_5c0[0] = 1;
    if (bVar1) {
      local_5c0[0] = 3;
    }
    if (local_5c0[0] == 0) {
      _kjCondition_6._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_6._39_1_ != '\0') {
        kj::_::Debug::log<char_const(&)[74],int&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                   ,0x8ae,ERROR,
                   "\"failed: expected \" \"context.network.forwardCount == addReflectionLeg ? 3 : 1\", _kjCondition"
                   ,(char (*) [74])
                    "failed: expected context.network.forwardCount == addReflectionLeg ? 3 : 1",
                   local_5c0);
        _kjCondition_6._39_1_ = 0;
      }
    }
    _aDStack_628 = kj::_::DebugExpressionStart::operator<<
                             ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                              (uint *)&context.network.forwardingEnabled);
    _kjCondition_7._36_4_ = 0;
    kj::_::DebugExpression<unsigned_int&>::operator==
              ((DebugComparison<unsigned_int_&,_int> *)local_620,aDStack_628,
               (int *)&_kjCondition_7.field_0x24);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_620);
    if (!bVar1) {
      _kjCondition_7._35_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_7._35_1_ != '\0') {
        kj::_::Debug::log<char_const(&)[57],kj::_::DebugComparison<unsigned_int&,int>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                   ,0x8af,ERROR,
                   "\"failed: expected \" \"context.network.deniedForwardCount == 0\", _kjCondition"
                   ,(char (*) [57])"failed: expected context.network.deniedForwardCount == 0",
                   (DebugComparison<unsigned_int_&,_int> *)local_620);
        _kjCondition_7._35_1_ = 0;
      }
    }
  }
  capnproto_test::capnp::test::TestMoreStuff::Client::~Client((Client *)local_288);
  capnproto_test::capnp::test::TestInterface::Client::~Client((Client *)local_260);
  TestContext::~TestContext((TestContext *)&alice);
  return;
}

Assistant:

void doForwardingTest(bool allowForwarding, bool addReflectionLeg) {
  TestContext context;
  context.network.forwardingEnabled = allowForwarding;

  // Set up Alice, Bob, Carol, and Dave.
  auto& alice = context.alice;
  auto& bob = context.bob;

  int carolCallCount = 0;
  int carolHandleCount = 0;
  auto& carol = context.initVat("carol",
      kj::heap<TestMoreStuffImpl>(carolCallCount, carolHandleCount));

  int eveCallCount = 0;
  int eveHandleCount = 0;

  // Arrange for Dave to forward all calls to Carol.
  auto& dave = [&]() -> TestContext::Vat& {
    auto paf = kj::newPromiseAndFulfiller<Capability::Client>();
    auto& dave = context.initVat("dave", kj::mv(paf.promise));

    kj::Maybe<test::TestMoreStuff::Client> holdBouncer = kj::none;
    if (addReflectionLeg) {
      // Add a `holdBouncer`, so the capability gets bounced from Dave to Eve and back to Dave
      // again before forwarding on to Carol.
      context.initVat("eve", kj::heap<TestMoreStuffImpl>(eveCallCount, eveHandleCount));
      holdBouncer = dave.connect<test::TestMoreStuff>("eve");
    }

    paf.fulfiller->fulfill(kj::heap<TestNoTailForwarder>(
        dave.connect<test::TestMoreStuff>("carol"), kj::mv(holdBouncer)));
    return dave;
  }();

  // Alice connects to Bob and Dave.
  auto bobCap = context.alice.connect<test::TestInterface>("bob");
  auto daveCap = context.alice.connect<test::TestMoreStuff>("dave");

  // Send `bobCap` to Dave, who sends it on to Carol.
  {
    auto req = daveCap.holdRequest();
    req.setCap(kj::mv(bobCap));
    req.send().wait(context.waitScope);
  }

  // Pump event loop to allow things to settle.
  context.waitScope.poll();

  // Tell Dave to invoke the held capability. Dave forwards to Carol. This forces Carol to connect
  // to Bob.
  {
    auto resp = daveCap.callHeldRequest().send().wait(context.waitScope);
    KJ_EXPECT(resp.getS() == "bar");
  }

  // Dave is connected to Carol, who is connected to Bob.
  KJ_EXPECT(dave.vatNetwork.getConnectionTo(carol.vatNetwork) != kj::none);
  KJ_EXPECT(carol.vatNetwork.getConnectionTo(bob.vatNetwork) != kj::none);

  // Carol never connected to Alice.
  KJ_EXPECT(carol.vatNetwork.getConnectionTo(alice.vatNetwork) == kj::none);

  if (allowForwarding) {
    // Dave never connected to Bob.
    KJ_EXPECT(dave.vatNetwork.getConnectionTo(bob.vatNetwork) == kj::none);

    // Forwarding occurred.
    KJ_EXPECT(context.network.forwardCount == addReflectionLeg ? 3 : 1);
    KJ_EXPECT(context.network.deniedForwardCount == 0);
  } else {
    // Dave had to accept the capability from Bob before forwarding it, so had to connect to bob.
    KJ_EXPECT(dave.vatNetwork.getConnectionTo(bob.vatNetwork) != kj::none);

    // No forwarding occurred.
    KJ_EXPECT(context.network.forwardCount == 0);
    KJ_EXPECT(context.network.deniedForwardCount == 1);
  }
}